

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  ulong uVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  parasail_result_t *ppVar34;
  __m128i *ptr;
  __m128i *palVar35;
  __m128i *ptr_00;
  int16_t *ptr_01;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  ulong size;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  long lVar45;
  __m128i *ptr_02;
  long lVar46;
  uint uVar47;
  undefined2 uVar48;
  ushort uVar49;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  ulong uVar54;
  ushort uVar63;
  ushort uVar67;
  ushort uVar69;
  ushort uVar71;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar61;
  ushort uVar65;
  ushort uVar73;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar75;
  undefined4 uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar86;
  int iVar87;
  int iVar88;
  undefined1 auVar85 [16];
  short sVar89;
  short sVar90;
  undefined1 auVar91 [16];
  short sVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ulong uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar108 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar109 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar110 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  int local_170;
  int local_13c;
  short local_108;
  short sStack_106;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar50;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar70;
  short sVar72;
  short sVar74;
  short sVar107;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar39 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse41_128_16_cold_1();
          }
          else {
            uVar40 = uVar3 - 1;
            uVar54 = (ulong)uVar3 + 7;
            size = uVar54 >> 3;
            uVar8 = (ulong)uVar40 % size;
            iVar30 = (int)(uVar40 / size);
            uVar42 = -open;
            uVar4 = ppVar6->min;
            iVar32 = -uVar4;
            if (uVar4 != uVar42 && SBORROW4(uVar4,uVar42) == (int)(uVar4 + open) < 0) {
              iVar32 = open;
            }
            iVar43 = ppVar6->max;
            ppVar34 = parasail_result_new_table1((uint)uVar54 & 0x7ffffff8,s2Len);
            if (ppVar34 != (parasail_result_t *)0x0) {
              ppVar34->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar34->flag | 0x8220802;
              ptr = parasail_memalign___m128i(0x10,size);
              palVar35 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar35 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar31 = s2Len + -1;
                uVar37 = 7 - iVar30;
                auVar55 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar51 = auVar55._0_4_;
                auVar55 = pshuflw(auVar55,ZEXT416((uint)gap),0);
                uVar52 = auVar55._0_4_;
                uVar47 = iVar32 - 0x7fff;
                auVar55 = pshuflw(ZEXT416(uVar47),ZEXT416(uVar47),0);
                uVar53 = auVar55._0_4_;
                auVar56 = ZEXT416(CONCAT22((short)(uVar4 >> 0x10),0x7ffe - (short)iVar43));
                auVar56 = pshuflw(auVar56,auVar56,0);
                auVar57 = pshuflw(ZEXT416(uVar37),ZEXT416(uVar37),0);
                lVar38 = (long)(int)uVar42;
                uVar44 = 0;
                do {
                  lVar46 = 0;
                  lVar45 = lVar38;
                  do {
                    lVar41 = lVar45;
                    if (s1_beg != 0) {
                      lVar41 = 0;
                    }
                    uVar48 = 0x8000;
                    if (-0x8000 < lVar41) {
                      uVar48 = (undefined2)lVar41;
                    }
                    *(undefined2 *)((long)&local_48 + lVar46 * 2) = uVar48;
                    lVar41 = lVar41 - (ulong)(uint)open;
                    if (lVar41 < -0x7fff) {
                      lVar41 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar46 * 2) = (short)lVar41;
                    lVar46 = lVar46 + 1;
                    lVar45 = lVar45 - size * (uint)gap;
                  } while (lVar46 != 8);
                  ptr[uVar44][0] = local_48;
                  ptr[uVar44][1] = lStack_40;
                  ptr_00[uVar44][0] = local_58;
                  ptr_00[uVar44][1] = lStack_50;
                  uVar44 = uVar44 + 1;
                  lVar38 = lVar38 - (ulong)(uint)gap;
                } while (uVar44 != size);
                *ptr_01 = 0;
                auVar85 = _DAT_00906ca0;
                lVar38 = uVar39 - 1;
                auVar91._8_4_ = (int)lVar38;
                auVar91._0_8_ = lVar38;
                auVar91._12_4_ = (int)((ulong)lVar38 >> 0x20);
                auVar81._4_4_ = gap;
                auVar81._0_4_ = gap;
                auVar81._8_4_ = gap;
                auVar81._12_4_ = gap;
                iVar32 = -gap;
                auVar108 = pmovsxbq(in_XMM11,0x100);
                auVar91 = auVar91 ^ _DAT_00906ca0;
                auVar109 = pmovsxbd(in_XMM14,0x7060504);
                auVar110 = pmovsxwd(in_XMM15,0x8000800080008000);
                iVar43 = 0;
                uVar44 = 0;
                do {
                  uVar76 = (undefined4)uVar44;
                  auVar102._8_4_ = uVar76;
                  auVar102._0_8_ = uVar44;
                  auVar102._12_4_ = (int)(uVar44 >> 0x20);
                  auVar77 = (auVar102 | auVar108) ^ auVar85;
                  lVar38 = auVar91._0_8_;
                  auVar78._0_8_ = -(ulong)(lVar38 < auVar77._0_8_);
                  lVar45 = auVar91._8_8_;
                  auVar78._8_8_ = -(ulong)(lVar45 < auVar77._8_8_);
                  auVar104 = pshuflw(in_XMM9,auVar78,0xe8);
                  auVar77._8_4_ = 0xffffffff;
                  auVar77._0_8_ = 0xffffffffffffffff;
                  auVar77._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar104 ^ auVar77,auVar104 ^ auVar77);
                  auVar104._4_4_ = iVar32;
                  auVar104._0_4_ = uVar42;
                  auVar104._8_8_ = 0;
                  iVar84 = uVar42 - iVar43;
                  iVar86 = iVar32 - open;
                  iVar87 = uVar42 - (gap * 2 + iVar43);
                  iVar88 = uVar42 - (gap * 3 + iVar43);
                  iVar14 = auVar110._0_4_;
                  iVar15 = auVar110._4_4_;
                  iVar16 = auVar110._8_4_;
                  iVar17 = auVar110._12_4_;
                  uVar93 = 0;
                  if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar84 < iVar14) * auVar110._0_2_ |
                             (ushort)(iVar84 >= iVar14) * (short)iVar84;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 1] = uVar94;
                  }
                  auVar78 = packssdw(auVar78,auVar78);
                  auVar23._8_4_ = 0xffffffff;
                  auVar23._0_8_ = 0xffffffffffffffff;
                  auVar23._12_4_ = 0xffffffff;
                  auVar78 = packssdw(auVar78 ^ auVar23,auVar78 ^ auVar23);
                  if ((auVar78 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar86 < iVar15) * auVar110._4_2_ |
                             (ushort)(iVar86 >= iVar15) * (short)iVar86;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 2] = uVar94;
                  }
                  auVar78 = (auVar102 | _DAT_00903a80) ^ auVar85;
                  auVar79._0_8_ = -(ulong)(lVar38 < auVar78._0_8_);
                  auVar79._8_8_ = -(ulong)(lVar45 < auVar78._8_8_);
                  auVar77 = packssdw(auVar77,auVar79);
                  auVar24._8_4_ = 0xffffffff;
                  auVar24._0_8_ = 0xffffffffffffffff;
                  auVar24._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar24,auVar77 ^ auVar24);
                  if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar87 < iVar16) * auVar110._8_2_ |
                             (ushort)(iVar87 >= iVar16) * (short)iVar87;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 3] = uVar94;
                  }
                  auVar77 = pshufhw(auVar79,auVar79,0x84);
                  auVar25._8_4_ = 0xffffffff;
                  auVar25._0_8_ = 0xffffffffffffffff;
                  auVar25._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar25,auVar77 ^ auVar25);
                  if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar88 < iVar17) * auVar110._12_2_ |
                             (ushort)(iVar88 >= iVar17) * (short)iVar88;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 4] = uVar94;
                  }
                  auVar105._4_4_ = uVar76;
                  auVar105._0_4_ = uVar76;
                  auVar105._8_4_ = uVar76;
                  auVar105._12_4_ = uVar76;
                  in_XMM9 = pmulld(auVar105 | auVar109,auVar81);
                  iVar84 = uVar42 - in_XMM9._0_4_;
                  iVar86 = uVar42 - in_XMM9._4_4_;
                  iVar87 = uVar42 - in_XMM9._8_4_;
                  iVar88 = uVar42 - in_XMM9._12_4_;
                  auVar77 = (auVar102 | _DAT_00903ad0) ^ auVar85;
                  auVar80._0_8_ = -(ulong)(lVar38 < auVar77._0_8_);
                  auVar80._8_8_ = -(ulong)(lVar45 < auVar77._8_8_);
                  auVar77 = pshuflw(auVar104,auVar80,0xe8);
                  auVar26._8_4_ = 0xffffffff;
                  auVar26._0_8_ = 0xffffffffffffffff;
                  auVar26._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar26,auVar77 ^ auVar26);
                  if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar84 < iVar14) * auVar110._0_2_ |
                             (ushort)(iVar84 >= iVar14) * (short)iVar84;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 5] = uVar94;
                  }
                  auVar77 = packssdw(auVar80,auVar80);
                  auVar27._8_4_ = 0xffffffff;
                  auVar27._0_8_ = 0xffffffffffffffff;
                  auVar27._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar27,auVar77 ^ auVar27);
                  if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar86 < iVar15) * auVar110._4_2_ |
                             (ushort)(iVar86 >= iVar15) * (short)iVar86;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 6] = uVar94;
                  }
                  auVar78 = (auVar102 | _DAT_00903ac0) ^ auVar85;
                  auVar103._0_8_ = -(ulong)(lVar38 < auVar78._0_8_);
                  auVar103._8_8_ = -(ulong)(lVar45 < auVar78._8_8_);
                  auVar77 = packssdw(auVar77,auVar103);
                  auVar28._8_4_ = 0xffffffff;
                  auVar28._0_8_ = 0xffffffffffffffff;
                  auVar28._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar28,auVar77 ^ auVar28);
                  if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar87 < iVar16) * auVar110._8_2_ |
                             (ushort)(iVar87 >= iVar16) * (short)iVar87;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 7] = uVar94;
                  }
                  auVar77 = pshufhw(auVar77,auVar103,0x84);
                  auVar29._8_4_ = 0xffffffff;
                  auVar29._0_8_ = 0xffffffffffffffff;
                  auVar29._12_4_ = 0xffffffff;
                  auVar77 = packssdw(auVar77 ^ auVar29,auVar77 ^ auVar29);
                  if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    uVar94 = (ushort)(iVar88 < iVar17) * auVar110._12_2_ |
                             (ushort)(iVar88 >= iVar17) * (short)iVar88;
                    if (s2_beg != 0) {
                      uVar94 = uVar93;
                    }
                    ptr_01[uVar44 + 8] = uVar94;
                  }
                  uVar44 = uVar44 + 8;
                  iVar32 = iVar32 + gap * -8;
                  iVar43 = iVar43 + gap * 8;
                } while ((s2Len + 7U & 0xfffffff8) != uVar44);
                uVar4 = (uint)size;
                lVar45 = size * uVar39;
                lVar38 = 0;
                local_108 = auVar57._0_2_;
                sStack_106 = auVar57._2_2_;
                auVar108._0_2_ = -(ushort)(local_108 == 7);
                auVar108._2_2_ = -(ushort)(sStack_106 == 6);
                auVar108._4_2_ = -(ushort)(local_108 == 5);
                auVar108._6_2_ = -(ushort)(sStack_106 == 4);
                auVar108._8_2_ = -(ushort)(local_108 == 3);
                auVar108._10_2_ = -(ushort)(sStack_106 == 2);
                auVar108._12_2_ = -(ushort)(local_108 == 1);
                auVar108._14_2_ = -(ushort)(sStack_106 == 0);
                uVar44 = 0;
                auVar57._4_4_ = uVar53;
                auVar57._0_4_ = uVar53;
                auVar57._8_4_ = uVar53;
                auVar57._12_4_ = uVar53;
                local_78 = auVar56._0_2_;
                uStack_76 = auVar56._2_2_;
                auVar56 = auVar57;
                auVar85 = auVar57;
                uVar93 = local_78;
                uVar94 = uStack_76;
                uVar95 = local_78;
                uVar96 = uStack_76;
                uVar97 = local_78;
                uVar98 = uStack_76;
                uVar99 = local_78;
                uVar100 = uStack_76;
                local_170 = iVar31;
                do {
                  ptr_02 = ptr;
                  ptr = palVar35;
                  uVar36 = ptr_02[uVar4 - 1][0];
                  iVar32 = ppVar6->mapper[(byte)s2[uVar44]];
                  auVar109._8_8_ = ptr_02[uVar4 - 1][1] << 0x10 | uVar36 >> 0x30;
                  auVar109._0_8_ = uVar36 << 0x10 | (ulong)(ushort)ptr_01[uVar44];
                  lVar41 = 0;
                  lVar46 = lVar38;
                  auVar91 = auVar85;
                  auVar110 = auVar57;
                  do {
                    auVar85 = paddsw(auVar109,*(undefined1 (*) [16])
                                               ((long)pvVar5 + lVar41 + size * (long)iVar32 * 0x10))
                    ;
                    auVar81 = *(undefined1 (*) [16])((long)*ptr_00 + lVar41);
                    sVar90 = auVar110._0_2_;
                    sVar50 = auVar81._0_2_;
                    uVar49 = (ushort)(sVar50 < sVar90) * sVar90 |
                             (ushort)(sVar50 >= sVar90) * sVar50;
                    sVar107 = auVar110._2_2_;
                    sVar62 = auVar81._2_2_;
                    uVar61 = (ushort)(sVar62 < sVar107) * sVar107 |
                             (ushort)(sVar62 >= sVar107) * sVar62;
                    sVar9 = auVar110._4_2_;
                    sVar64 = auVar81._4_2_;
                    uVar63 = (ushort)(sVar64 < sVar9) * sVar9 | (ushort)(sVar64 >= sVar9) * sVar64;
                    sVar10 = auVar110._6_2_;
                    sVar66 = auVar81._6_2_;
                    uVar65 = (ushort)(sVar66 < sVar10) * sVar10 |
                             (ushort)(sVar66 >= sVar10) * sVar66;
                    sVar11 = auVar110._8_2_;
                    sVar68 = auVar81._8_2_;
                    uVar67 = (ushort)(sVar68 < sVar11) * sVar11 |
                             (ushort)(sVar68 >= sVar11) * sVar68;
                    sVar12 = auVar110._10_2_;
                    sVar70 = auVar81._10_2_;
                    uVar69 = (ushort)(sVar70 < sVar12) * sVar12 |
                             (ushort)(sVar70 >= sVar12) * sVar70;
                    sVar13 = auVar110._12_2_;
                    sVar72 = auVar81._12_2_;
                    sVar74 = auVar81._14_2_;
                    uVar71 = (ushort)(sVar72 < sVar13) * sVar13 |
                             (ushort)(sVar72 >= sVar13) * sVar72;
                    sVar75 = auVar110._14_2_;
                    uVar73 = (ushort)(sVar74 < sVar75) * sVar75 |
                             (ushort)(sVar74 >= sVar75) * sVar74;
                    sVar89 = auVar85._0_2_;
                    auVar58._0_2_ =
                         (ushort)((short)uVar49 < sVar89) * sVar89 |
                         ((short)uVar49 >= sVar89) * uVar49;
                    sVar89 = auVar85._2_2_;
                    auVar58._2_2_ =
                         (ushort)((short)uVar61 < sVar89) * sVar89 |
                         ((short)uVar61 >= sVar89) * uVar61;
                    sVar89 = auVar85._4_2_;
                    auVar58._4_2_ =
                         (ushort)((short)uVar63 < sVar89) * sVar89 |
                         ((short)uVar63 >= sVar89) * uVar63;
                    sVar89 = auVar85._6_2_;
                    auVar58._6_2_ =
                         (ushort)((short)uVar65 < sVar89) * sVar89 |
                         ((short)uVar65 >= sVar89) * uVar65;
                    sVar89 = auVar85._8_2_;
                    auVar58._8_2_ =
                         (ushort)((short)uVar67 < sVar89) * sVar89 |
                         ((short)uVar67 >= sVar89) * uVar67;
                    sVar89 = auVar85._10_2_;
                    auVar58._10_2_ =
                         (ushort)((short)uVar69 < sVar89) * sVar89 |
                         ((short)uVar69 >= sVar89) * uVar69;
                    sVar89 = auVar85._12_2_;
                    auVar58._12_2_ =
                         (ushort)((short)uVar71 < sVar89) * sVar89 |
                         ((short)uVar71 >= sVar89) * uVar71;
                    sVar89 = auVar85._14_2_;
                    auVar58._14_2_ =
                         (ushort)((short)uVar73 < sVar89) * sVar89 |
                         ((short)uVar73 >= sVar89) * uVar73;
                    *(undefined1 (*) [16])((long)*ptr + lVar41) = auVar58;
                    piVar7 = ((ppVar34->field_4).rowcols)->score_row;
                    *(int *)((long)piVar7 + lVar46) = (int)(short)auVar58._0_2_;
                    *(int *)((long)piVar7 + lVar45 * 4 + lVar46) = (int)(short)auVar58._2_2_;
                    *(int *)((long)piVar7 + lVar45 * 8 + lVar46) = (int)(short)auVar58._4_2_;
                    *(int *)((long)piVar7 + lVar45 * 0xc + lVar46) = (int)(short)auVar58._6_2_;
                    *(int *)((long)piVar7 + lVar45 * 0x10 + lVar46) = (int)(short)auVar58._8_2_;
                    *(int *)((long)piVar7 + lVar45 * 0x14 + lVar46) = (int)(short)auVar58._10_2_;
                    *(int *)((long)piVar7 + lVar45 * 0x18 + lVar46) = (int)(short)auVar58._12_2_;
                    *(int *)((long)piVar7 + lVar45 * 0x1c + lVar46) = (int)(short)auVar58._14_2_;
                    sVar89 = auVar91._0_2_;
                    auVar85._0_2_ =
                         (sVar89 < (short)auVar58._0_2_) * auVar58._0_2_ |
                         (ushort)(sVar89 >= (short)auVar58._0_2_) * sVar89;
                    sVar89 = auVar91._2_2_;
                    auVar85._2_2_ =
                         (sVar89 < (short)auVar58._2_2_) * auVar58._2_2_ |
                         (ushort)(sVar89 >= (short)auVar58._2_2_) * sVar89;
                    sVar89 = auVar91._4_2_;
                    auVar85._4_2_ =
                         (sVar89 < (short)auVar58._4_2_) * auVar58._4_2_ |
                         (ushort)(sVar89 >= (short)auVar58._4_2_) * sVar89;
                    sVar89 = auVar91._6_2_;
                    auVar85._6_2_ =
                         (sVar89 < (short)auVar58._6_2_) * auVar58._6_2_ |
                         (ushort)(sVar89 >= (short)auVar58._6_2_) * sVar89;
                    sVar89 = auVar91._8_2_;
                    auVar85._8_2_ =
                         (sVar89 < (short)auVar58._8_2_) * auVar58._8_2_ |
                         (ushort)(sVar89 >= (short)auVar58._8_2_) * sVar89;
                    sVar89 = auVar91._10_2_;
                    auVar85._10_2_ =
                         (sVar89 < (short)auVar58._10_2_) * auVar58._10_2_ |
                         (ushort)(sVar89 >= (short)auVar58._10_2_) * sVar89;
                    sVar89 = auVar91._12_2_;
                    sVar92 = auVar91._14_2_;
                    auVar85._12_2_ =
                         (sVar89 < (short)auVar58._12_2_) * auVar58._12_2_ |
                         (ushort)(sVar89 >= (short)auVar58._12_2_) * sVar89;
                    auVar85._14_2_ =
                         (sVar92 < (short)auVar58._14_2_) * auVar58._14_2_ |
                         (ushort)(sVar92 >= (short)auVar58._14_2_) * sVar92;
                    uVar93 = (ushort)(sVar50 < (short)uVar93) * sVar50 |
                             (sVar50 >= (short)uVar93) * uVar93;
                    uVar94 = (ushort)(sVar62 < (short)uVar94) * sVar62 |
                             (sVar62 >= (short)uVar94) * uVar94;
                    uVar95 = (ushort)(sVar64 < (short)uVar95) * sVar64 |
                             (sVar64 >= (short)uVar95) * uVar95;
                    uVar96 = (ushort)(sVar66 < (short)uVar96) * sVar66 |
                             (sVar66 >= (short)uVar96) * uVar96;
                    uVar97 = (ushort)(sVar68 < (short)uVar97) * sVar68 |
                             (sVar68 >= (short)uVar97) * uVar97;
                    uVar98 = (ushort)(sVar70 < (short)uVar98) * sVar70 |
                             (sVar70 >= (short)uVar98) * uVar98;
                    uVar99 = (ushort)(sVar72 < (short)uVar99) * sVar72 |
                             (sVar72 >= (short)uVar99) * uVar99;
                    uVar100 = (ushort)(sVar74 < (short)uVar100) * sVar74 |
                              (sVar74 >= (short)uVar100) * uVar100;
                    uVar93 = (ushort)(sVar90 < (short)uVar93) * sVar90 |
                             (sVar90 >= (short)uVar93) * uVar93;
                    uVar94 = (ushort)(sVar107 < (short)uVar94) * sVar107 |
                             (sVar107 >= (short)uVar94) * uVar94;
                    uVar95 = (ushort)(sVar9 < (short)uVar95) * sVar9 |
                             (sVar9 >= (short)uVar95) * uVar95;
                    uVar96 = (ushort)(sVar10 < (short)uVar96) * sVar10 |
                             (sVar10 >= (short)uVar96) * uVar96;
                    uVar97 = (ushort)(sVar11 < (short)uVar97) * sVar11 |
                             (sVar11 >= (short)uVar97) * uVar97;
                    uVar98 = (ushort)(sVar12 < (short)uVar98) * sVar12 |
                             (sVar12 >= (short)uVar98) * uVar98;
                    uVar99 = (ushort)(sVar13 < (short)uVar99) * sVar13 |
                             (sVar13 >= (short)uVar99) * uVar99;
                    uVar100 = (ushort)(sVar75 < (short)uVar100) * sVar75 |
                              (sVar75 >= (short)uVar100) * uVar100;
                    uVar93 = ((short)auVar58._0_2_ < (short)uVar93) * auVar58._0_2_ |
                             ((short)auVar58._0_2_ >= (short)uVar93) * uVar93;
                    uVar94 = ((short)auVar58._2_2_ < (short)uVar94) * auVar58._2_2_ |
                             ((short)auVar58._2_2_ >= (short)uVar94) * uVar94;
                    uVar95 = ((short)auVar58._4_2_ < (short)uVar95) * auVar58._4_2_ |
                             ((short)auVar58._4_2_ >= (short)uVar95) * uVar95;
                    uVar96 = ((short)auVar58._6_2_ < (short)uVar96) * auVar58._6_2_ |
                             ((short)auVar58._6_2_ >= (short)uVar96) * uVar96;
                    uVar97 = ((short)auVar58._8_2_ < (short)uVar97) * auVar58._8_2_ |
                             ((short)auVar58._8_2_ >= (short)uVar97) * uVar97;
                    uVar98 = ((short)auVar58._10_2_ < (short)uVar98) * auVar58._10_2_ |
                             ((short)auVar58._10_2_ >= (short)uVar98) * uVar98;
                    uVar99 = ((short)auVar58._12_2_ < (short)uVar99) * auVar58._12_2_ |
                             ((short)auVar58._12_2_ >= (short)uVar99) * uVar99;
                    uVar100 = ((short)auVar58._14_2_ < (short)uVar100) * auVar58._14_2_ |
                              ((short)auVar58._14_2_ >= (short)uVar100) * uVar100;
                    auVar18._4_4_ = uVar51;
                    auVar18._0_4_ = uVar51;
                    auVar18._8_4_ = uVar51;
                    auVar18._12_4_ = uVar51;
                    auVar91 = psubsw(auVar58,auVar18);
                    auVar20._4_4_ = uVar52;
                    auVar20._0_4_ = uVar52;
                    auVar20._8_4_ = uVar52;
                    auVar20._12_4_ = uVar52;
                    auVar81 = psubsw(auVar81,auVar20);
                    sVar90 = auVar91._0_2_;
                    sVar75 = auVar81._0_2_;
                    sVar89 = auVar91._2_2_;
                    sVar50 = auVar81._2_2_;
                    sVar107 = auVar91._4_2_;
                    sVar62 = auVar81._4_2_;
                    sVar9 = auVar91._6_2_;
                    sVar64 = auVar81._6_2_;
                    sVar10 = auVar91._8_2_;
                    sVar66 = auVar81._8_2_;
                    sVar11 = auVar91._10_2_;
                    sVar68 = auVar81._10_2_;
                    sVar12 = auVar91._12_2_;
                    sVar70 = auVar81._12_2_;
                    sVar72 = auVar81._14_2_;
                    sVar13 = auVar91._14_2_;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar41);
                    *puVar1 = (ushort)(sVar75 < sVar90) * sVar90 |
                              (ushort)(sVar75 >= sVar90) * sVar75;
                    puVar1[1] = (ushort)(sVar50 < sVar89) * sVar89 |
                                (ushort)(sVar50 >= sVar89) * sVar50;
                    puVar1[2] = (ushort)(sVar62 < sVar107) * sVar107 |
                                (ushort)(sVar62 >= sVar107) * sVar62;
                    puVar1[3] = (ushort)(sVar64 < sVar9) * sVar9 |
                                (ushort)(sVar64 >= sVar9) * sVar64;
                    puVar1[4] = (ushort)(sVar66 < sVar10) * sVar10 |
                                (ushort)(sVar66 >= sVar10) * sVar66;
                    puVar1[5] = (ushort)(sVar68 < sVar11) * sVar11 |
                                (ushort)(sVar68 >= sVar11) * sVar68;
                    puVar1[6] = (ushort)(sVar70 < sVar12) * sVar12 |
                                (ushort)(sVar70 >= sVar12) * sVar70;
                    puVar1[7] = (ushort)(sVar72 < sVar13) * sVar13 |
                                (ushort)(sVar72 >= sVar13) * sVar72;
                    auVar21._4_4_ = uVar52;
                    auVar21._0_4_ = uVar52;
                    auVar21._8_4_ = uVar52;
                    auVar21._12_4_ = uVar52;
                    auVar91 = psubsw(auVar110,auVar21);
                    sVar75 = auVar91._0_2_;
                    auVar110._0_2_ =
                         (ushort)(sVar75 < sVar90) * sVar90 | (ushort)(sVar75 >= sVar90) * sVar75;
                    sVar90 = auVar91._2_2_;
                    auVar110._2_2_ =
                         (ushort)(sVar90 < sVar89) * sVar89 | (ushort)(sVar90 >= sVar89) * sVar90;
                    sVar90 = auVar91._4_2_;
                    auVar110._4_2_ =
                         (ushort)(sVar90 < sVar107) * sVar107 | (ushort)(sVar90 >= sVar107) * sVar90
                    ;
                    sVar90 = auVar91._6_2_;
                    auVar110._6_2_ =
                         (ushort)(sVar90 < sVar9) * sVar9 | (ushort)(sVar90 >= sVar9) * sVar90;
                    sVar90 = auVar91._8_2_;
                    auVar110._8_2_ =
                         (ushort)(sVar90 < sVar10) * sVar10 | (ushort)(sVar90 >= sVar10) * sVar90;
                    sVar90 = auVar91._10_2_;
                    auVar110._10_2_ =
                         (ushort)(sVar90 < sVar11) * sVar11 | (ushort)(sVar90 >= sVar11) * sVar90;
                    sVar90 = auVar91._12_2_;
                    sVar89 = auVar91._14_2_;
                    auVar110._12_2_ =
                         (ushort)(sVar90 < sVar12) * sVar12 | (ushort)(sVar90 >= sVar12) * sVar90;
                    auVar110._14_2_ =
                         (ushort)(sVar89 < sVar13) * sVar13 | (ushort)(sVar89 >= sVar13) * sVar89;
                    auVar109 = *(undefined1 (*) [16])((long)*ptr_02 + lVar41);
                    lVar41 = lVar41 + 0x10;
                    lVar46 = lVar46 + uVar39 * 4;
                    auVar91 = auVar85;
                  } while (size << 4 != lVar41);
                  local_13c = 0;
                  do {
                    uVar33 = uVar42;
                    if (s2_beg == 0) {
                      uVar33 = ptr_01[uVar44 + 1] - open;
                    }
                    uVar36 = (ulong)uVar33;
                    if ((int)uVar33 < -0x7fff) {
                      uVar36 = 0xffff8000;
                    }
                    uVar101 = auVar110._0_8_;
                    auVar110._8_8_ = auVar110._8_8_ << 0x10 | uVar101 >> 0x30;
                    auVar110._0_8_ = uVar101 << 0x10 | uVar36 & 0xffff;
                    lVar41 = 0;
                    lVar46 = lVar38;
                    auVar91 = auVar85;
                    do {
                      psVar2 = (short *)((long)*ptr + lVar41);
                      sVar89 = *psVar2;
                      sVar107 = psVar2[1];
                      sVar9 = psVar2[2];
                      sVar10 = psVar2[3];
                      sVar11 = psVar2[4];
                      sVar12 = psVar2[5];
                      sVar13 = psVar2[6];
                      sVar75 = psVar2[7];
                      sVar90 = auVar110._0_2_;
                      auVar59._0_2_ =
                           (ushort)(sVar89 < sVar90) * sVar90 | (ushort)(sVar89 >= sVar90) * sVar89;
                      sVar90 = auVar110._2_2_;
                      auVar59._2_2_ =
                           (ushort)(sVar107 < sVar90) * sVar90 |
                           (ushort)(sVar107 >= sVar90) * sVar107;
                      sVar90 = auVar110._4_2_;
                      auVar59._4_2_ =
                           (ushort)(sVar9 < sVar90) * sVar90 | (ushort)(sVar9 >= sVar90) * sVar9;
                      sVar90 = auVar110._6_2_;
                      auVar59._6_2_ =
                           (ushort)(sVar10 < sVar90) * sVar90 | (ushort)(sVar10 >= sVar90) * sVar10;
                      sVar90 = auVar110._8_2_;
                      auVar59._8_2_ =
                           (ushort)(sVar11 < sVar90) * sVar90 | (ushort)(sVar11 >= sVar90) * sVar11;
                      sVar90 = auVar110._10_2_;
                      auVar59._10_2_ =
                           (ushort)(sVar12 < sVar90) * sVar90 | (ushort)(sVar12 >= sVar90) * sVar12;
                      sVar90 = auVar110._12_2_;
                      auVar59._12_2_ =
                           (ushort)(sVar13 < sVar90) * sVar90 | (ushort)(sVar13 >= sVar90) * sVar13;
                      sVar90 = auVar110._14_2_;
                      auVar59._14_2_ =
                           (ushort)(sVar75 < sVar90) * sVar90 | (ushort)(sVar75 >= sVar90) * sVar75;
                      *(undefined1 (*) [16])((long)*ptr + lVar41) = auVar59;
                      uVar93 = ((short)auVar59._0_2_ < (short)uVar93) * auVar59._0_2_ |
                               ((short)auVar59._0_2_ >= (short)uVar93) * uVar93;
                      uVar94 = ((short)auVar59._2_2_ < (short)uVar94) * auVar59._2_2_ |
                               ((short)auVar59._2_2_ >= (short)uVar94) * uVar94;
                      uVar95 = ((short)auVar59._4_2_ < (short)uVar95) * auVar59._4_2_ |
                               ((short)auVar59._4_2_ >= (short)uVar95) * uVar95;
                      uVar96 = ((short)auVar59._6_2_ < (short)uVar96) * auVar59._6_2_ |
                               ((short)auVar59._6_2_ >= (short)uVar96) * uVar96;
                      uVar97 = ((short)auVar59._8_2_ < (short)uVar97) * auVar59._8_2_ |
                               ((short)auVar59._8_2_ >= (short)uVar97) * uVar97;
                      uVar98 = ((short)auVar59._10_2_ < (short)uVar98) * auVar59._10_2_ |
                               ((short)auVar59._10_2_ >= (short)uVar98) * uVar98;
                      uVar99 = ((short)auVar59._12_2_ < (short)uVar99) * auVar59._12_2_ |
                               ((short)auVar59._12_2_ >= (short)uVar99) * uVar99;
                      uVar100 = ((short)auVar59._14_2_ < (short)uVar100) * auVar59._14_2_ |
                                ((short)auVar59._14_2_ >= (short)uVar100) * uVar100;
                      sVar90 = auVar91._0_2_;
                      auVar85._0_2_ =
                           (sVar90 < (short)auVar59._0_2_) * auVar59._0_2_ |
                           (ushort)(sVar90 >= (short)auVar59._0_2_) * sVar90;
                      sVar90 = auVar91._2_2_;
                      auVar85._2_2_ =
                           (sVar90 < (short)auVar59._2_2_) * auVar59._2_2_ |
                           (ushort)(sVar90 >= (short)auVar59._2_2_) * sVar90;
                      sVar90 = auVar91._4_2_;
                      auVar85._4_2_ =
                           (sVar90 < (short)auVar59._4_2_) * auVar59._4_2_ |
                           (ushort)(sVar90 >= (short)auVar59._4_2_) * sVar90;
                      sVar90 = auVar91._6_2_;
                      auVar85._6_2_ =
                           (sVar90 < (short)auVar59._6_2_) * auVar59._6_2_ |
                           (ushort)(sVar90 >= (short)auVar59._6_2_) * sVar90;
                      sVar90 = auVar91._8_2_;
                      auVar85._8_2_ =
                           (sVar90 < (short)auVar59._8_2_) * auVar59._8_2_ |
                           (ushort)(sVar90 >= (short)auVar59._8_2_) * sVar90;
                      sVar90 = auVar91._10_2_;
                      auVar85._10_2_ =
                           (sVar90 < (short)auVar59._10_2_) * auVar59._10_2_ |
                           (ushort)(sVar90 >= (short)auVar59._10_2_) * sVar90;
                      sVar90 = auVar91._12_2_;
                      sVar89 = auVar91._14_2_;
                      auVar85._12_2_ =
                           (sVar90 < (short)auVar59._12_2_) * auVar59._12_2_ |
                           (ushort)(sVar90 >= (short)auVar59._12_2_) * sVar90;
                      auVar85._14_2_ =
                           (sVar89 < (short)auVar59._14_2_) * auVar59._14_2_ |
                           (ushort)(sVar89 >= (short)auVar59._14_2_) * sVar89;
                      piVar7 = ((ppVar34->field_4).rowcols)->score_row;
                      *(int *)((long)piVar7 + lVar46) = (int)(short)auVar59._0_2_;
                      *(int *)((long)piVar7 + lVar45 * 4 + lVar46) = (int)(short)auVar59._2_2_;
                      *(int *)((long)piVar7 + lVar45 * 8 + lVar46) = (int)(short)auVar59._4_2_;
                      *(int *)((long)piVar7 + lVar45 * 0xc + lVar46) = (int)(short)auVar59._6_2_;
                      *(int *)((long)piVar7 + lVar45 * 0x10 + lVar46) = (int)(short)auVar59._8_2_;
                      *(int *)((long)piVar7 + lVar45 * 0x14 + lVar46) = (int)(short)auVar59._10_2_;
                      *(int *)((long)piVar7 + lVar45 * 0x18 + lVar46) = (int)(short)auVar59._12_2_;
                      *(int *)((long)piVar7 + lVar45 * 0x1c + lVar46) = (int)(short)auVar59._14_2_;
                      auVar19._4_4_ = uVar51;
                      auVar19._0_4_ = uVar51;
                      auVar19._8_4_ = uVar51;
                      auVar19._12_4_ = uVar51;
                      auVar91 = psubsw(auVar59,auVar19);
                      auVar22._4_4_ = uVar52;
                      auVar22._0_4_ = uVar52;
                      auVar22._8_4_ = uVar52;
                      auVar22._12_4_ = uVar52;
                      auVar110 = psubsw(auVar110,auVar22);
                      auVar82._0_2_ = -(ushort)(auVar91._0_2_ < auVar110._0_2_);
                      auVar82._2_2_ = -(ushort)(auVar91._2_2_ < auVar110._2_2_);
                      auVar82._4_2_ = -(ushort)(auVar91._4_2_ < auVar110._4_2_);
                      auVar82._6_2_ = -(ushort)(auVar91._6_2_ < auVar110._6_2_);
                      auVar82._8_2_ = -(ushort)(auVar91._8_2_ < auVar110._8_2_);
                      auVar82._10_2_ = -(ushort)(auVar91._10_2_ < auVar110._10_2_);
                      auVar82._12_2_ = -(ushort)(auVar91._12_2_ < auVar110._12_2_);
                      auVar82._14_2_ = -(ushort)(auVar91._14_2_ < auVar110._14_2_);
                      if ((((((((((((((((auVar82 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar82 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar82 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar82 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar82 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar82 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar82 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar82 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar82 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar82 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar82 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar82 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar82 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar82._14_2_ >> 7 & 1) == 0) && (auVar82._14_2_ & 0x8000) == 0)
                      goto LAB_006c7c9a;
                      lVar41 = lVar41 + 0x10;
                      lVar46 = lVar46 + uVar39 * 4;
                      auVar91 = auVar85;
                    } while (size << 4 != lVar41);
                    local_13c = local_13c + 1;
                  } while (local_13c != 8);
LAB_006c7c9a:
                  palVar35 = ptr + uVar8;
                  sVar90 = (short)(*palVar35)[0];
                  sVar89 = *(short *)((long)*palVar35 + 2);
                  sVar107 = *(short *)((long)*palVar35 + 4);
                  sVar9 = *(short *)((long)*palVar35 + 6);
                  sVar10 = (short)(*palVar35)[1];
                  sVar11 = *(short *)((long)*palVar35 + 10);
                  sVar12 = *(short *)((long)*palVar35 + 0xc);
                  sVar13 = *(short *)((long)*palVar35 + 0xe);
                  sVar75 = auVar56._0_2_;
                  auVar83._0_2_ = -(ushort)(sVar75 < sVar90);
                  sVar50 = auVar56._2_2_;
                  auVar83._2_2_ = -(ushort)(sVar50 < sVar89);
                  sVar62 = auVar56._4_2_;
                  auVar83._4_2_ = -(ushort)(sVar62 < sVar107);
                  sVar64 = auVar56._6_2_;
                  auVar83._6_2_ = -(ushort)(sVar64 < sVar9);
                  sVar66 = auVar56._8_2_;
                  auVar83._8_2_ = -(ushort)(sVar66 < sVar10);
                  sVar68 = auVar56._10_2_;
                  auVar83._10_2_ = -(ushort)(sVar68 < sVar11);
                  sVar70 = auVar56._12_2_;
                  auVar83._12_2_ = -(ushort)(sVar70 < sVar12);
                  sVar72 = auVar56._14_2_;
                  auVar83._14_2_ = -(ushort)(sVar72 < sVar13);
                  auVar83 = auVar83 & auVar108;
                  auVar56._0_2_ =
                       (ushort)(sVar90 < sVar75) * sVar75 | (ushort)(sVar90 >= sVar75) * sVar90;
                  auVar56._2_2_ =
                       (ushort)(sVar89 < sVar50) * sVar50 | (ushort)(sVar89 >= sVar50) * sVar89;
                  auVar56._4_2_ =
                       (ushort)(sVar107 < sVar62) * sVar62 | (ushort)(sVar107 >= sVar62) * sVar107;
                  auVar56._6_2_ =
                       (ushort)(sVar9 < sVar64) * sVar64 | (ushort)(sVar9 >= sVar64) * sVar9;
                  auVar56._8_2_ =
                       (ushort)(sVar10 < sVar66) * sVar66 | (ushort)(sVar10 >= sVar66) * sVar10;
                  auVar56._10_2_ =
                       (ushort)(sVar11 < sVar68) * sVar68 | (ushort)(sVar11 >= sVar68) * sVar11;
                  auVar56._12_2_ =
                       (ushort)(sVar12 < sVar70) * sVar70 | (ushort)(sVar12 >= sVar70) * sVar12;
                  auVar56._14_2_ =
                       (ushort)(sVar13 < sVar72) * sVar72 | (ushort)(sVar13 >= sVar72) * sVar13;
                  if ((((((((((((((((auVar83 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar83 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar83 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar83 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar83 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar83 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar83 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar83 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar83 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar83 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar83 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar83 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar83 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar83 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar83[0xf] < '\0') {
                    local_170 = (int)uVar44;
                  }
                  uVar44 = uVar44 + 1;
                  lVar38 = lVar38 + 4;
                  palVar35 = ptr_02;
                  if (uVar44 == uVar39) {
                    if (s2_end != 0) {
                      if (iVar30 < 7) {
                        iVar32 = 0;
                        auVar57 = auVar56;
                        do {
                          auVar60._0_8_ = auVar57._0_8_ << 0x10;
                          auVar60._8_8_ = auVar57._8_8_ << 0x10 | auVar57._0_8_ >> 0x30;
                          auVar56._14_2_ = auVar57._12_2_;
                          iVar32 = iVar32 + 1;
                          auVar57 = auVar60;
                        } while (iVar32 < (int)uVar37);
                      }
                      uVar47 = (uint)auVar56._14_2_;
                    }
                    sVar90 = (short)uVar47;
                    uVar42 = uVar40;
                    if ((s1_end != 0) && ((uVar54 & 0x7ffffff8) != 0)) {
                      uVar39 = 0;
                      do {
                        uVar33 = ((uint)uVar39 & 7) * uVar4 + ((uint)(uVar39 >> 3) & 0x1fffffff);
                        if ((int)uVar33 < (int)uVar3) {
                          auVar56._14_2_ = *(ushort *)((long)*ptr + uVar39 * 2);
                          if ((short)(ushort)uVar47 < (short)auVar56._14_2_) {
                            uVar47 = (uint)auVar56._14_2_;
                            uVar42 = uVar33;
                            local_170 = iVar31;
                          }
                          else {
                            if ((int)uVar42 <= (int)uVar33) {
                              uVar33 = uVar42;
                            }
                            if (local_170 != iVar31) {
                              uVar33 = uVar42;
                            }
                            if (auVar56._14_2_ == (ushort)uVar47) {
                              uVar42 = uVar33;
                            }
                          }
                        }
                        sVar90 = (short)uVar47;
                        uVar39 = uVar39 + 1;
                      } while ((uVar4 & 0xfffffff) << 3 != (int)uVar39);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      uVar39 = ptr[uVar8][1];
                      if (iVar30 < 7) {
                        iVar32 = 0;
                        uVar54 = ptr[uVar8][0];
                        do {
                          uVar39 = uVar39 << 0x10 | uVar54 >> 0x30;
                          iVar32 = iVar32 + 1;
                          uVar54 = uVar54 << 0x10;
                        } while (iVar32 < (int)uVar37);
                      }
                      sVar90 = (short)(uVar39 >> 0x30);
                      uVar42 = uVar40;
                      local_170 = iVar31;
                    }
                    sVar89 = auVar55._0_2_;
                    auVar106._0_2_ = -(ushort)((short)uVar93 < sVar89);
                    sVar107 = auVar55._2_2_;
                    auVar106._2_2_ = -(ushort)((short)uVar94 < sVar107);
                    auVar106._4_2_ = -(ushort)((short)uVar95 < sVar89);
                    auVar106._6_2_ = -(ushort)((short)uVar96 < sVar107);
                    auVar106._8_2_ = -(ushort)((short)uVar97 < sVar89);
                    auVar106._10_2_ = -(ushort)((short)uVar98 < sVar107);
                    auVar106._12_2_ = -(ushort)((short)uVar99 < sVar89);
                    auVar106._14_2_ = -(ushort)((short)uVar100 < sVar107);
                    auVar55._0_2_ = -(ushort)((short)local_78 < (short)auVar85._0_2_);
                    auVar55._2_2_ = -(ushort)((short)uStack_76 < (short)auVar85._2_2_);
                    auVar55._4_2_ = -(ushort)((short)local_78 < (short)auVar85._4_2_);
                    auVar55._6_2_ = -(ushort)((short)uStack_76 < (short)auVar85._6_2_);
                    auVar55._8_2_ = -(ushort)((short)local_78 < (short)auVar85._8_2_);
                    auVar55._10_2_ = -(ushort)((short)uStack_76 < (short)auVar85._10_2_);
                    auVar55._12_2_ = -(ushort)((short)local_78 < (short)auVar85._12_2_);
                    auVar55._14_2_ = -(ushort)((short)uStack_76 < (short)auVar85._14_2_);
                    auVar55 = auVar55 | auVar106;
                    if ((((((((((((((((auVar55 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar55 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar55 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar55 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar55 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar55 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar55 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar55 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar55 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar55 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar55 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar55 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar55 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar55[0xf] < '\0') {
                      *(byte *)&ppVar34->flag = (byte)ppVar34->flag | 0x40;
                      sVar90 = 0;
                      local_170 = 0;
                      uVar42 = 0;
                    }
                    ppVar34->score = (int)sVar90;
                    ppVar34->end_query = uVar42;
                    ppVar34->end_ref = local_170;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar34;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}